

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

void Assimp::IFC::CleanupWindowContour(ProjectedWindowContour *window)

{
  pointer paVar1;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  IfcVector2 *pip;
  pointer paVar2;
  double dVar3;
  Polygon subject;
  ExPolygons clipped;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> scratch;
  Clipper clipper;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_158;
  ExPolygons local_138;
  IntPoint local_118;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_108;
  Clipper local_f0;
  
  local_108.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
  local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (IntPoint *)0x0;
  ClipperLib::Clipper::Clipper(&local_f0);
  local_138.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar2 = (window->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar1 = (window->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar2 != paVar1) {
    do {
      dVar3 = paVar2->x * 1518500249.0;
      local_118.X = (long64)dVar3;
      local_118.X = (long)(dVar3 - 9.223372036854776e+18) & local_118.X >> 0x3f | local_118.X;
      dVar3 = paVar2->y * 1518500249.0;
      local_118.Y = (long64)dVar3;
      local_118.Y = (long)(dVar3 - 9.223372036854776e+18) & local_118.Y >> 0x3f | local_118.Y;
      if (local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        _M_realloc_insert<ClipperLib::IntPoint>
                  (&local_158,
                   (iterator)
                   local_158.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_118);
      }
      else {
        (local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->X = local_118.X;
        (local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->Y = local_118.Y;
        local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_158.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
      paVar2 = paVar2 + 1;
    } while (paVar2 != paVar1);
  }
  ClipperLib::ClipperBase::AddPolygon
            ((ClipperBase *)(local_f0._vptr_Clipper[-3] + (long)&local_f0._vptr_Clipper),&local_158,
             ptSubject);
  ClipperLib::Clipper::Execute(&local_f0,ctUnion,&local_138,pftNonZero,pftNonZero);
  if ((long)local_138.
            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_138.
            super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x30) {
    if (local_138.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_138.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5c34e2);
      paVar2 = (window->contour).
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((window->contour).
          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish != paVar2) {
        (window->contour).
        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paVar2;
      }
      goto LAB_005c3493;
    }
    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5c3482);
  }
  ExtractVerticesFromClipper
            (&(local_138.
               super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
               _M_impl.super__Vector_impl_data._M_start)->outer,&local_108,false);
LAB_005c3493:
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&local_138);
  ClipperLib::Clipper::~Clipper(&local_f0);
  if (local_158.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CleanupWindowContour(ProjectedWindowContour& window)
{
    std::vector<IfcVector2> scratch;
    std::vector<IfcVector2>& contour = window.contour;

    ClipperLib::Polygon subject;
    ClipperLib::Clipper clipper;
    ClipperLib::ExPolygons clipped;

    for(const IfcVector2& pip : contour) {
        subject.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
    }

    clipper.AddPolygon(subject,ClipperLib::ptSubject);
    clipper.Execute(ClipperLib::ctUnion,clipped,ClipperLib::pftNonZero,ClipperLib::pftNonZero);

    // This should yield only one polygon or something went wrong
    if (clipped.size() != 1) {

        // Empty polygon? drop the contour altogether
        if(clipped.empty()) {
            IFCImporter::LogError("error during polygon clipping, window contour is degenerate");
            window.FlagInvalid();
            return;
        }

        // Else: take the first only
        IFCImporter::LogError("error during polygon clipping, window contour is not convex");
    }

    ExtractVerticesFromClipper(clipped[0].outer, scratch);
    // Assume the bounding box doesn't change during this operation
}